

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

char * __thiscall double_conversion::StringBuilder::Finalize(StringBuilder *this)

{
  char *pcVar1;
  Vector<char> *in_RDI;
  
  pcVar1 = Vector<char>::operator[](in_RDI,*(int *)&in_RDI[1].start_);
  *pcVar1 = '\0';
  *(undefined4 *)&in_RDI[1].start_ = 0xffffffff;
  pcVar1 = Vector<char>::start(in_RDI);
  return pcVar1;
}

Assistant:

char* Finalize() {
    DOUBLE_CONVERSION_ASSERT(!is_finalized() && position_ < buffer_.length());
    buffer_[position_] = '\0';
    // Make sure nobody managed to add a 0-character to the
    // buffer while building the string.
    DOUBLE_CONVERSION_ASSERT(strlen(buffer_.start()) == static_cast<size_t>(position_));
    position_ = -1;
    DOUBLE_CONVERSION_ASSERT(is_finalized());
    return buffer_.start();
  }